

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

void __thiscall
nlohmann::detail::
binary_writer<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_unsigned_char>
::write_compact_float
          (binary_writer<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_unsigned_char>
           *this,number_float_t n,input_format_t format)

{
  element_type *peVar1;
  undefined8 uVar2;
  double dVar3;
  
  if (ABS(n) <= 3.4028234663852886e+38) {
    dVar3 = (double)(float)n;
    if ((dVar3 == n) && (!NAN(dVar3) && !NAN(n))) {
      peVar1 = (this->oa).
               super___shared_ptr<nlohmann::detail::output_adapter_protocol<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      uVar2 = 0xca;
      if (format == cbor) {
        uVar2 = 0xfa;
      }
      (**peVar1->_vptr_output_adapter_protocol)(peVar1,uVar2);
      binary_writer<nlohmann::basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char>
      ::write_number<float,false>
                ((binary_writer<nlohmann::basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char>
                  *)this,(float)n);
      return;
    }
  }
  peVar1 = (this->oa).
           super___shared_ptr<nlohmann::detail::output_adapter_protocol<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  uVar2 = 0xcb;
  if (format == cbor) {
    uVar2 = 0xfb;
  }
  (**peVar1->_vptr_output_adapter_protocol)(peVar1,uVar2);
  binary_writer<nlohmann::basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char>
  ::write_number<double,false>
            ((binary_writer<nlohmann::basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char>
              *)this,n);
  return;
}

Assistant:

void write_compact_float(const number_float_t n, detail::input_format_t format)
    {
#ifdef __GNUC__
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wfloat-equal"
#endif
        if (static_cast<double>(n) >= static_cast<double>(std::numeric_limits<float>::lowest()) &&
                static_cast<double>(n) <= static_cast<double>((std::numeric_limits<float>::max)()) &&
                static_cast<double>(static_cast<float>(n)) == static_cast<double>(n))
        {
            oa->write_character(format == detail::input_format_t::cbor
                                ? get_cbor_float_prefix(static_cast<float>(n))
                                : get_msgpack_float_prefix(static_cast<float>(n)));
            write_number(static_cast<float>(n));
        }
        else
        {
            oa->write_character(format == detail::input_format_t::cbor
                                ? get_cbor_float_prefix(n)
                                : get_msgpack_float_prefix(n));
            write_number(n);
        }
#ifdef __GNUC__
#pragma GCC diagnostic pop
#endif
    }